

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O3

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name,
          SchemaInfo **enclosingSchema)

{
  XMLSize_t XVar1;
  DOMElement *pDVar2;
  SchemaInfo *this_00;
  XMLSize_t getAt;
  
  if (this->fSchemaRootElement == (DOMElement *)0x0) {
    return (DOMElement *)0x0;
  }
  pDVar2 = getTopLevelComponent(this,compCategory,compName,name);
  if (pDVar2 == (DOMElement *)0x0) {
    if ((this->fIncludeInfoList != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
       (XVar1 = (this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount,
       XVar1 != 0)) {
      getAt = 0;
      do {
        this_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                            (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>
                             ,getAt);
        if ((this_00 != this) &&
           (pDVar2 = getTopLevelComponent(this_00,compCategory,compName,name),
           pDVar2 != (DOMElement *)0x0)) {
          *enclosingSchema = this_00;
          return pDVar2;
        }
        getAt = getAt + 1;
      } while (XVar1 != getAt);
    }
    pDVar2 = (DOMElement *)0x0;
  }
  return pDVar2;
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name,
                                 SchemaInfo** enclosingSchema) {

    if (fSchemaRootElement == 0)
      return 0;

    SchemaInfo* currentInfo = this;
    DOMElement* child = getTopLevelComponent(compCategory, compName, name);

    if (child == 0) {

        XMLSize_t listSize = (fIncludeInfoList) ? fIncludeInfoList->size() : 0;

        for (XMLSize_t i=0; i < listSize; i++) {

            currentInfo = fIncludeInfoList->elementAt(i);

            if (currentInfo == this)
                continue;

            child = currentInfo->getTopLevelComponent(compCategory, compName, name);

            if (child != 0) {

                *enclosingSchema = currentInfo;
                break;
            }
        }
    }

    return child;
}